

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O0

int __thiscall
FormatTypeEDSK::LoadDisk
          (FormatTypeEDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  IDisk *this_00;
  ulong uVar7;
  Track *pTVar8;
  MFMTrack *pMVar9;
  Sector *pSVar10;
  uchar *puVar11;
  ulong uVar12;
  ulong *puVar13;
  undefined8 *puVar14;
  Revolution *pRVar15;
  ulong uVar16;
  anon_struct_48_3_f145af35 *local_140;
  anon_struct_48_3_f145af35 *local_120;
  uint local_f4;
  uint local_e0;
  int local_dc;
  uint track_1;
  int side_2;
  Track trk;
  uint rev;
  uint nb_revolutions;
  uint track;
  int side_1;
  int side;
  uchar sector_index_buffer [2];
  void *pvStack_98;
  int dbg;
  uchar *track_block;
  uint local_88;
  uint total_size;
  uint offset_1;
  uint count;
  int iStack_78;
  uchar sectorSize_L;
  uint tn;
  uint offset_from_start;
  uint size_to_remove_for_sector;
  uchar *header;
  uint local_60;
  uint index_header;
  uint offset;
  uint k;
  int j;
  int i;
  int m_NbTracks;
  IDisk *new_disk;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  size_t size_local;
  uchar *buffer_local;
  FormatTypeEDSK *this_local;
  
  if (*(long *)buffer == 0x4445444e45545845) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[0x30];
    uVar6 = (uint)bVar1;
    this_00->nb_sides_ = buffer[0x31];
    if (2 < this_00->nb_sides_) {
      this_00->nb_sides_ = '\x02';
    }
    for (k = 0; (int)k < (int)(uint)this_00->nb_sides_; k = k + 1) {
      local_60 = k + 0x34;
      this->side_[(int)k].nb_tracks = bVar1;
      this_00->side_[(int)k].nb_tracks = uVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)uVar6;
      uVar7 = SUB168(auVar2 * ZEXT816(0x28),0);
      if (SUB168(auVar2 * ZEXT816(0x28),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pTVar8 = (Track *)operator_new__(uVar7);
      this->side_[(int)k].tracks = pTVar8;
      local_f4 = uVar6;
      if (uVar6 < 0x2a) {
        local_f4 = 0x2a;
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(int)local_f4;
      uVar7 = SUB168(auVar3 * ZEXT816(0x20),0);
      if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pMVar9 = (MFMTrack *)operator_new__(uVar7);
      this_00->side_[(int)k].tracks = pMVar9;
      memset(this_00->side_[(int)k].tracks,0,(long)(int)uVar6 << 5);
      memset(this->side_[(int)k].tracks,0,(long)(int)uVar6 * 0x28);
      for (offset = 0; (int)offset < (int)uVar6; offset = offset + 1) {
        this->side_[(int)k].tracks[(int)offset].track_size = (uint)buffer[local_60] << 8;
        local_60 = this_00->nb_sides_ + local_60;
      }
    }
    header._4_4_ = 0x100;
    for (offset = 0; (int)offset < (int)uVar6; offset = offset + 1) {
      for (k = 0; (int)k < (int)(uint)this_00->nb_sides_; k = k + 1) {
        if (this->side_[(int)k].tracks[(int)offset].track_size < 0x101) {
          header._4_4_ = this->side_[(int)k].tracks[(int)offset].track_size + header._4_4_;
          this->side_[(int)k].tracks[(int)offset].formatted = false;
        }
        else {
          this->side_[(int)k].tracks[(int)offset].formatted = true;
          _offset_from_start = buffer + header._4_4_;
          header._4_4_ = header._4_4_ + 0x100;
          iVar5 = memcmp(_offset_from_start,"Track-Info",10);
          if (iVar5 != 0) {
            if (this_00 != (IDisk *)0x0) {
              (*this_00->_vptr_IDisk[1])();
            }
            return -2;
          }
          tn = 0x100;
          iStack_78 = 0x18;
          count = (uint)_offset_from_start[0x10];
          if (count != offset) {
            count = offset;
          }
          bVar1 = _offset_from_start[0x14];
          this->side_[(int)k].tracks[count].sz = bVar1;
          this->side_[(int)k].tracks[count].sector_size = 0x80 << (bVar1 & 0x1f);
          this->side_[(int)k].tracks[count].nb_sector = (uint)_offset_from_start[0x15];
          this->side_[(int)k].tracks[count].gap3 = _offset_from_start[0x16];
          this->side_[(int)k].tracks[count].gap3_filler = 'N';
          auVar2 = ZEXT416(this->side_[(int)k].tracks[count].nb_sector) * ZEXT816(0x1d0);
          uVar7 = auVar2._0_8_;
          if (auVar2._8_8_ != 0) {
            uVar7 = 0xffffffffffffffff;
          }
          pSVar10 = (Sector *)operator_new__(uVar7);
          this->side_[(int)k].tracks[count].sectors = pSVar10;
          total_size = 0;
          local_88 = 0;
          track_block._4_4_ = 0;
          for (index_header = 0; index_header < this->side_[(int)k].tracks[count].nb_sector;
              index_header = index_header + 1) {
            memset(this->side_[(int)k].tracks[count].sectors + index_header,0,0x1d0);
            if (0x100U - iStack_78 < (total_size + 1) * 8) {
              _offset_from_start = buffer + header._4_4_;
              header._4_4_ = header._4_4_ + 0x100;
              tn = tn + 0x100;
              iStack_78 = 0;
              total_size = 0;
            }
            this->side_[(int)k].tracks[count].sectors[index_header].track =
                 _offset_from_start[iStack_78 + total_size * 8];
            this->side_[(int)k].tracks[count].sectors[index_header].side =
                 _offset_from_start[iStack_78 + total_size * 8 + 1];
            this->side_[(int)k].tracks[count].sectors[index_header].sector_id =
                 _offset_from_start[iStack_78 + total_size * 8 + 2];
            this->side_[(int)k].tracks[count].sectors[index_header].sector_size =
                 _offset_from_start[iStack_78 + total_size * 8 + 3];
            this->side_[(int)k].tracks[count].sectors[index_header].fdc_status_1 =
                 _offset_from_start[iStack_78 + total_size * 8 + 4];
            this->side_[(int)k].tracks[count].sectors[index_header].fdc_status_2 =
                 _offset_from_start[iStack_78 + total_size * 8 + 5];
            this->side_[(int)k].tracks[count].sectors[index_header].actual_size =
                 (ushort)_offset_from_start[iStack_78 + total_size * 8 + 6];
            pSVar10 = this->side_[(int)k].tracks[count].sectors;
            pSVar10[index_header].actual_size =
                 pSVar10[index_header].actual_size +
                 (ushort)_offset_from_start[iStack_78 + total_size * 8 + 7] * 0x100;
            track_block._4_4_ =
                 this->side_[(int)k].tracks[count].sectors[index_header].actual_size +
                 track_block._4_4_;
            total_size = total_size + 1;
          }
          if ((this->side_[(int)k].tracks[(int)offset].track_size - tn < track_block._4_4_) &&
             (0xff00 < track_block._4_4_)) {
            if ((track_block._4_4_ & 0xff) != 0) {
              track_block._4_4_ = (0x100 - (track_block._4_4_ & 0xff)) + track_block._4_4_;
            }
            this->side_[(int)k].tracks[(int)offset].track_size = track_block._4_4_;
            pvStack_98 = operator_new__((long)this->side_[(int)k].tracks[(int)offset].track_size);
            memcpy(pvStack_98,buffer + header._4_4_,
                   (long)this->side_[(int)k].tracks[(int)offset].track_size);
            iVar5 = this->side_[(int)k].tracks[(int)offset].track_size;
          }
          else {
            pvStack_98 = operator_new__((ulong)(this->side_[(int)k].tracks[(int)offset].track_size -
                                               tn));
            memcpy(pvStack_98,buffer + header._4_4_,
                   (ulong)(this->side_[(int)k].tracks[(int)offset].track_size - tn));
            iVar5 = this->side_[(int)k].tracks[(int)offset].track_size - tn;
          }
          header._4_4_ = iVar5 + header._4_4_;
          for (index_header = 0; index_header < this->side_[(int)k].tracks[count].nb_sector;
              index_header = index_header + 1) {
            if (this->side_[(int)k].tracks[count].sectors[index_header].actual_size == 0) {
              this->side_[(int)k].tracks[count].sectors[index_header].data = (uchar *)0x0;
            }
            else {
              puVar11 = (uchar *)operator_new__((ulong)this->side_[(int)k].tracks[count].sectors
                                                       [index_header].actual_size);
              this->side_[(int)k].tracks[count].sectors[index_header].data = puVar11;
              memcpy(this->side_[(int)k].tracks[count].sectors[index_header].data,
                     (void *)((long)pvStack_98 + (ulong)local_88),
                     (ulong)this->side_[(int)k].tracks[count].sectors[index_header].actual_size);
              local_88 = this->side_[(int)k].tracks[count].sectors[index_header].actual_size +
                         local_88;
            }
          }
          if (pvStack_98 != (void *)0x0) {
            operator_delete__(pvStack_98);
          }
        }
      }
    }
    if (((header._4_4_ != 0) && (header._4_4_ + 0xf < size)) &&
       (iVar5 = memcmp(buffer + header._4_4_,"Offset-Info\r\n",0xe), iVar5 == 0)) {
      header._4_4_ = header._4_4_ + 0xf;
      this->extended_offset_ = true;
      for (track = 0; (int)track < (int)(uint)this_00->nb_sides_; track = track + 1) {
        for (k = 0; (int)k < (int)uVar6; k = k + 1) {
          for (index_header = 0; header._4_4_ = header._4_4_ + 2,
              index_header < this->side_[(int)track].tracks[(int)k].nb_sector;
              index_header = index_header + 1) {
            this->side_[(int)track].tracks[(int)k].sectors[index_header].sector_index =
                 (*(ushort *)(buffer + header._4_4_) & 0xff) +
                 (*(ushort *)(buffer + header._4_4_) & 0xff00);
          }
        }
      }
    }
    for (nb_revolutions = 0; (int)nb_revolutions < (int)(uint)this_00->nb_sides_;
        nb_revolutions = nb_revolutions + 1) {
      for (rev = 0; rev < this_00->side_[(int)nb_revolutions].nb_tracks; rev = rev + 1) {
        uVar6 = GetNbRevolutions(this,nb_revolutions,rev);
        this_00->side_[(int)nb_revolutions].tracks[rev].nb_revolutions = uVar6;
        uVar7 = CONCAT44(0,uVar6);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar7;
        uVar12 = SUB168(auVar4 * ZEXT816(0x30),0);
        uVar16 = uVar12 + 8;
        if (SUB168(auVar4 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar12) {
          uVar16 = 0xffffffffffffffff;
        }
        puVar13 = (ulong *)operator_new__(uVar16);
        *puVar13 = uVar7;
        pRVar15 = (Revolution *)(puVar13 + 1);
        if (uVar7 != 0) {
          local_120 = (anon_struct_48_3_f145af35 *)pRVar15;
          do {
            IDisk::anon_struct_48_3_f145af35::Revolution(local_120);
            local_120 = local_120 + 1;
          } while (local_120 != (anon_struct_48_3_f145af35 *)(pRVar15 + uVar7));
        }
        this_00->side_[(int)nb_revolutions].tracks[rev].revolution = pRVar15;
        for (trk.gap3_size_ = 0;
            (uint)trk.gap3_size_ < this_00->side_[(int)nb_revolutions].tracks[rev].nb_revolutions;
            trk.gap3_size_ = trk.gap3_size_ + 1) {
          FillTrackMfm(this,this_00,nb_revolutions,rev,trk.gap3_size_);
          IDisk::Track::Track((Track *)&track_1);
          IDisk::GetTrackInfoForRev(this_00,nb_revolutions,rev,(Track *)&track_1,0);
          IDisk::Track::~Track((Track *)&track_1);
        }
      }
    }
    for (local_dc = 0; local_dc < (int)(uint)this_00->nb_sides_; local_dc = local_dc + 1) {
      for (local_e0 = this_00->side_[local_dc].nb_tracks; local_e0 < 0x2a; local_e0 = local_e0 + 1)
      {
        this_00->side_[local_dc].tracks[local_e0].nb_revolutions = 1;
        puVar14 = (undefined8 *)operator_new__(0x38);
        *puVar14 = 1;
        local_140 = (anon_struct_48_3_f145af35 *)(puVar14 + 1);
        do {
          IDisk::anon_struct_48_3_f145af35::Revolution(local_140);
          local_140 = local_140 + 1;
        } while (local_140 != (anon_struct_48_3_f145af35 *)(puVar14 + 7));
        this_00->side_[local_dc].tracks[local_e0].revolution = (Revolution *)(puVar14 + 1);
        (this_00->side_[local_dc].tracks[local_e0].revolution)->size = 0x40000;
        puVar11 = (uchar *)operator_new__(0x40000);
        (this_00->side_[local_dc].tracks[local_e0].revolution)->bitfield = puVar11;
        memset((this_00->side_[local_dc].tracks[local_e0].revolution)->bitfield,0,0x40000);
      }
      if (this_00->side_[local_dc].nb_tracks < 0x2a) {
        this_00->side_[local_dc].nb_tracks = 0x2a;
      }
    }
    (*this_00->_vptr_IDisk[0x14])();
    *created_disk = this_00;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int FormatTypeEDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                             ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "EXTENDED", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Extended
      // Name of creator : don't read
      // Number of tracks, and sides
      int m_NbTracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! - TODO
         new_disk->nb_sides_ = 2;
      }

      // Track size table
      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         unsigned int offset = 0x34 + i;
         side_[i].nb_tracks = m_NbTracks;
         new_disk->side_[i].nb_tracks = m_NbTracks;
         side_[i].tracks = new Track[m_NbTracks];
         new_disk->side_[i].tracks = new IDisk::MFMTrack[m_NbTracks < 42 ? 42 : m_NbTracks];
         memset(new_disk->side_[i].tracks, 0, (sizeof(IDisk::MFMTrack)) * m_NbTracks);
         memset(side_[i].tracks, 0, (sizeof(Track)) * m_NbTracks);
         for (j = 0; j < m_NbTracks; j++)
         {
            side_[i].tracks[j].track_size = (buffer[offset] << 8);
            //m_Side [i].Tracks[j].Formatted = ( header[offset] != 0);
            offset += new_disk->nb_sides_;
         }
      }
      unsigned int index_header = 0x100;

      for (j = 0; j < m_NbTracks; j++)
      {
         for (i = 0; i < new_disk->nb_sides_; i++)
         {
            // Formatted ?
            const unsigned char* header = buffer;

            if (side_[i].tracks[j].track_size > 0x100)
            {
               side_[i].tracks[j].formatted = true;

               header = &buffer[index_header];
               index_header += 0x100;
               //fread(header, 0x100, 1, file);

               if (memcmp(header, "Track-Info", 10) != 0)
               {
                  delete new_disk;
                  new_disk = nullptr;
                  return -2;
               }

               unsigned int size_to_remove_for_sector = 0x100;
               unsigned int offset_from_start = 0x18;
               //unsigned char* track_block = new unsigned char [m_Side[i].Tracks [j].TrackSize];
               //fread ( track_block, m_Side[i].Tracks [j].TrackSize-0x100, 1, file );
               // Track number
               unsigned int tn = header[0x10];
               if (tn != j)
               {
                  // bug...
                  //tn = m_NbTracks-1;
                  tn = j;
               }
               // Side number
               //i = header[0x11]; - Check this !
               if (i != header[0x11])
               {
               }
               unsigned char sectorSize_L = side_[i].tracks[tn].sz = header[0x14];
               side_[i].tracks[tn].sector_size = (0x80 << sectorSize_L);
               // Number of sector
               side_[i].tracks[tn].nb_sector = header[0x15];
               side_[i].tracks[tn].gap3 = header[0x16];
               side_[i].tracks[tn].gap3_filler = 0x4E; // header [0x17];
               side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
               // Sector info
               unsigned int count = 0;
               unsigned int offset = 0;
               unsigned int total_size = 0;

               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  memset(&side_[i].tracks[tn].sectors[k], 0x00, sizeof(Sector));

                  // Get next 0x100 bytes ?
                  if ((count + 1) * 8 > 0x100 - offset_from_start)
                  {
                     // Get next 0x100 bytes
                     //memcpy ( &header[0x18], track_block, 0x100-0x18 );
                     //fread(header, 0x100, 1, file);
                     header = &buffer[index_header];
                     index_header += 0x100;

                     size_to_remove_for_sector += 0x100;
                     offset_from_start = 0;
                     count = 0;
                  }
                  side_[i].tracks[tn].sectors[k].track = header[offset_from_start + count * 8 + 00];
                  side_[i].tracks[tn].sectors[k].side = header[offset_from_start + count * 8 + 01];
                  side_[i].tracks[tn].sectors[k].sector_id = header[offset_from_start + count * 8 + 02];
                  side_[i].tracks[tn].sectors[k].sector_size = header[offset_from_start + count * 8 + 03];
                  side_[i].tracks[tn].sectors[k].fdc_status_1 = header[offset_from_start + count * 8 + 04];
                  side_[i].tracks[tn].sectors[k].fdc_status_2 = header[offset_from_start + count * 8 + 05];
                  side_[i].tracks[tn].sectors[k].actual_size = header[offset_from_start + count * 8 + 06];
                  side_[i].tracks[tn].sectors[k].actual_size += header[offset_from_start + count * 8 + 07] * 256;
                  total_size += side_[i].tracks[tn].sectors[k].actual_size;
                  count++;
               }

               unsigned char* track_block = NULL;

               if (total_size > side_[i].tracks[j].track_size - size_to_remove_for_sector && total_size > 0xFF00)
               {
                  // "total_size" should be at last a multiple of 0x100
                  if ((total_size & 0xFF) != 0)
                  {
                     total_size += (0x100 - (total_size & 0xFF));
                  }
                  // Set the totalsize as a
                  side_[i].tracks[j].track_size = total_size;
                  track_block = new unsigned char[side_[i].tracks[j].track_size];
                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size);
                  index_header += side_[i].tracks[j].track_size;
               }
               else
               {
                  track_block = new unsigned char[side_[i].tracks[j].track_size - size_to_remove_for_sector];

                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size - size_to_remove_for_sector);
                  index_header += (side_[i].tracks[j].track_size - size_to_remove_for_sector);
               }

               // Data
               if (tn == 0x13)
               {
                  int dbg = 1;
               }
               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  if (side_[i].tracks[tn].sectors[k].actual_size == 0)
                  {
                     side_[i].tracks[tn].sectors[k].data = NULL;
                  }
                  else
                  {
                     side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sectors[k].actual_size
                     ];
                     memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset],
                            side_[i].tracks[tn].sectors[k].actual_size);
                     offset += side_[i].tracks[tn].sectors[k].actual_size;
                  }
               }
               delete[]track_block;
            }
            else
            {
               header = &buffer[index_header];
               index_header += side_[i].tracks[j].track_size;
               side_[i].tracks[j].formatted = false;
            }
         }
      }

      // Extension ? Offset-Info ?
      if (index_header > 0 && index_header + 0x0F < size)
      {
         unsigned char sector_index_buffer[2];
         //if (memcmp(header, "Offset-Info\r\n", 0x0E) == 0)
         if (memcmp(&buffer[index_header], "Offset-Info\r\n", 0x0E) == 0)
         {
            index_header += 0x0F;
            extended_offset_ = true;
            // OFFSET EXT.
            // For each track
            for (int side = 0; side < new_disk->nb_sides_; side++)
            {
               for (i = 0; i < m_NbTracks; i++)
               {
                  // Read track length
                  //fread(sector_index_buffer, 1, 2, file);
                  memcpy(sector_index_buffer, &buffer[index_header], 2);
                  index_header += 2;
                  // For each sector
                  for (k = 0; k < side_[side].tracks[i].nb_sector; k++)
                  {
                     // Read offset
                     //fread(sector_index_buffer, 1, 2, file);
                     memcpy(sector_index_buffer, &buffer[index_header], 2);
                     index_header += 2;

                     side_[side].tracks[i].sectors[k].sector_index = sector_index_buffer[0] + (sector_index_buffer[1] << 8);
                  }
               }
            }
         }
         else
         {
            //fseek(file, -0x0F, SEEK_CUR);
         }
      }

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Fill tracks
            unsigned int nb_revolutions = GetNbRevolutions(side, track);
            //unsigned int size = FillTrack (  side, track, NULL, 1 );
            new_disk->side_[side].tracks[track].nb_revolutions = nb_revolutions;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[nb_revolutions];

            for (unsigned int rev = 0; rev < new_disk->side_[side].tracks[track].nb_revolutions; rev++)
            {
               FillTrackMfm(new_disk, side, track, rev);

               IDisk::Track trk;
               LOG("TRACK ");
               LOG(i);
               LOGEOL
               new_disk->GetTrackInfoForRev(side, track, &trk);
               LOGEOL
            }
         }
      }

      // Complete to 42 tracks
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
         {
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
            new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
         }
         if (new_disk->side_[side].nb_tracks < 42)
            new_disk->side_[side].nb_tracks = 42;
      }

      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}